

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

ssize_t cf_h2_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  h1_req_parser *parser;
  cf_h2_ctx *ctx;
  HTTP *pHVar1;
  curl_off_t cVar2;
  ulong uVar3;
  ulong uVar4;
  _Bool _Var5;
  CURLcode CVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  nghttp2_nv *nva;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar13;
  size_t sVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  ssize_t sVar18;
  bool bVar19;
  long lVar20;
  ulong uVar21;
  nghttp2_session *session;
  nghttp2_data_provider *data_prd_00;
  ulong uVar22;
  stream_ctx *psVar23;
  size_t *psVar24;
  ulong local_e8;
  size_t nheader;
  stream_ctx *stream;
  Curl_easy *local_a8;
  nghttp2_nv *local_a0;
  Curl_cfilter *local_98;
  void *local_90;
  nghttp2_priority_spec local_84;
  dynhds h2_headers;
  nghttp2_data_provider data_prd;
  
  ctx = (cf_h2_ctx *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || (pHVar1 = (data->req).p.http, pHVar1 == (HTTP *)0x0)) {
    local_a8 = (ctx->call_data).data;
    (ctx->call_data).data = data;
LAB_005cf907:
    stream = (stream_ctx *)0x0;
    Curl_dynhds_init(&h2_headers,0,0x100000);
    CVar6 = http2_data_setup(cf,data,&stream);
    psVar23 = stream;
    *err = CVar6;
    if (CVar6 != CURLE_OK) goto LAB_005cf93e;
    parser = &stream->h1;
    uVar12 = Curl_h1_req_parse_read(parser,(char *)buf,len,(char *)0x0,0,err);
    local_e8 = uVar12;
    if (((long)uVar12 < 0) || ((psVar23->h1).done != true)) {
LAB_005cf942:
      nva = (nghttp2_nv *)0x0;
      if (data != (Curl_easy *)0x0) goto LAB_005cf952;
    }
    else {
      CVar6 = Curl_http_req_to_h2(&h2_headers,parser->req,data);
      *err = CVar6;
      if (CVar6 != CURLE_OK) {
LAB_005cf93e:
        local_e8 = 0xffffffffffffffff;
        goto LAB_005cf942;
      }
      local_90 = buf;
      Curl_h1_req_parse_free(parser);
      nva = Curl_dynhds_to_nva(&h2_headers,&nheader);
      if (nva == (nghttp2_nv *)0x0) {
        *err = CURLE_OUT_OF_MEMORY;
        goto LAB_005cf93e;
      }
      h2_pri_spec(data,&local_84);
      iVar11 = nghttp2_session_check_request_allowed(ctx->h2);
      if ((((data != (Curl_easy *)0x0) && (iVar11 == 0)) && (((data->set).field_0x8bd & 0x10) != 0))
         && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"send request NOT allowed (via nghttp2)");
      }
      if ((byte)((data->state).httpreq - 1) < 4) {
        psVar23->upload_left = (data->state).infilesize;
        data_prd_00 = &data_prd;
        data_prd.read_callback = req_body_read_callback;
        data_prd.source.ptr = (void *)0x0;
        session = ctx->h2;
      }
      else {
        psVar23->upload_left = 0;
        session = ctx->h2;
        data_prd_00 = (nghttp2_data_provider *)0x0;
      }
      uVar10 = nghttp2_submit_request(session,&local_84,nva,nheader,data_prd_00,data);
      uVar7 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
      if ((int)uVar10 < 0) {
        if (((uVar7 >> 0x1c & 1) != 0) && (0 < cf->cft->log_level)) {
          pcVar15 = nghttp2_strerror(uVar10);
          Curl_trc_cf_infof(data,cf,"send: nghttp2_submit_request error (%s)%u",pcVar15,
                            (ulong)uVar10);
        }
LAB_005d010b:
        *err = CURLE_SEND_ERROR;
        local_e8 = 0xffffffffffffffff;
      }
      else {
        if ((uVar7 >> 0x1c & 1) != 0) {
          local_98 = cf;
          Curl_infof(data,"[HTTP/2] [%d] OPENED stream for %s",(ulong)uVar10);
          psVar24 = &nva->valuelen;
          uVar22 = 0;
          local_a0 = nva;
          for (uVar21 = 0; cf = local_98, nva = local_a0, uVar21 < nheader; uVar21 = uVar21 + 1) {
            uVar3 = psVar24[-1];
            uVar4 = *psVar24;
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"[HTTP/2] [%d] [%.*s: %.*s]",uVar10,uVar3 & 0xffffffff,
                         ((nghttp2_nv *)(psVar24 + -3))->name,uVar4 & 0xffffffff,
                         (uint8_t *)psVar24[-2]);
            }
            uVar22 = uVar3 + uVar22 + uVar4;
            psVar24 = psVar24 + 5;
          }
          if ((60000 < uVar22) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,
                       "[HTTP/2] Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                       ,60000);
          }
        }
        psVar23->id = uVar10;
        psVar23->local_window_size = 0xa00000;
        lVar17 = (data->set).max_recv_speed;
        if (lVar17 != 0) {
          lVar16 = (lVar17 + -1) / 0x4000;
          lVar20 = 1;
          if (0xc000 < lVar17) {
            lVar20 = (lVar16 + 1) / 2;
          }
          lVar17 = lVar20 + lVar16 + 1;
          if (lVar17 < 0x280) {
            psVar23->local_window_size = (int)lVar17 << 0xe;
          }
        }
        local_e8 = len;
        if (len - uVar12 != 0) {
          sVar18 = Curl_bufq_write(&psVar23->sendbuf,(uchar *)((long)local_90 + uVar12),len - uVar12
                                   ,err);
          if (sVar18 < 0) goto LAB_005d010b;
          local_e8 = uVar12 + sVar18;
        }
      }
LAB_005cf952:
      if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0))
         && (0 < cf->cft->log_level)) {
        if (stream == (stream_ctx *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = (ulong)(uint)stream->id;
        }
        Curl_trc_cf_infof(data,cf,"[%d] submit -> %zd, %d",uVar12,local_e8,(ulong)*err);
      }
    }
    (*Curl_cfree)(nva);
    psVar23 = stream;
    Curl_dynhds_free(&h2_headers);
    bVar19 = false;
    if ((long)local_e8 < 0) {
LAB_005cfc96:
      if (psVar23 == (stream_ctx *)0x0) {
        if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
          CVar6 = *err;
          uVar10 = nghttp2_session_get_remote_window_size(ctx->h2);
          sVar13 = Curl_bufq_len(&ctx->outbufq);
          Curl_trc_cf_infof(data,cf,
                            "cf_send(len=%zu) -> %zd, %d, connection-window=%d, nw_send_buffer(%zu)"
                            ,len,local_e8,(ulong)CVar6,(ulong)uVar10,sVar13);
        }
        goto LAB_005cfde8;
      }
    }
    else {
LAB_005cfb02:
      CVar6 = h2_progress_egress(cf,data);
      if (((psVar23 == (stream_ctx *)0x0) || (bVar19)) || (psVar23->closed == false)) {
        if (CVar6 == CURLE_OK) {
          if (psVar23 == (stream_ctx *)0x0) {
            bVar19 = false;
          }
          else {
            _Var5 = Curl_bufq_is_empty(&psVar23->sendbuf);
            bVar19 = !_Var5;
          }
        }
        else {
          bVar19 = true;
          if (CVar6 != CURLE_AGAIN) {
            *err = CVar6;
            local_e8 = 0xffffffffffffffff;
            goto LAB_005cfc96;
          }
        }
        if ((((long)local_e8 < 1) || (psVar23 == (stream_ctx *)0x0)) || (!bVar19)) {
          iVar11 = should_close_session(ctx);
          if (iVar11 == 0) goto LAB_005cfc96;
          if (psVar23->closed == true) {
            local_e8 = http2_handle_stream_close(cf,data,psVar23,err);
          }
          else {
            if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
               (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level))
               )) {
              Curl_trc_cf_infof(data,cf,"send: nothing to do in this session");
            }
            *err = CURLE_HTTP2;
            local_e8 = 0xffffffffffffffff;
          }
          goto LAB_005cfc9f;
        }
        iVar8 = nghttp2_session_get_stream_remote_window_size(ctx->h2,psVar23->id);
        psVar23->upload_blocked_len = local_e8;
        if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          uVar10 = psVar23->id;
          uVar7 = nghttp2_session_get_remote_window_size(ctx->h2);
          Curl_trc_cf_infof(data,cf,"[%d] cf_send(len=%zu) BLOCK: win %u/%zu blocked_len=%zu",
                            (ulong)uVar10,len,(ulong)uVar7,(long)iVar8,local_e8);
        }
        *err = CURLE_AGAIN;
      }
      else {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"stream %u closed",(ulong)(uint)psVar23->id);
        }
        *err = CURLE_SEND_ERROR;
      }
      local_e8 = 0xffffffffffffffff;
    }
LAB_005cfc9f:
    if (data == (Curl_easy *)0x0) goto LAB_005cfde8;
  }
  else {
    psVar23 = (stream_ctx *)pHVar1->h2_ctx;
    local_a8 = (ctx->call_data).data;
    (ctx->call_data).data = data;
    if ((psVar23 == (stream_ctx *)0x0) || (psVar23->id == 0xffffffff)) goto LAB_005cf907;
    uVar12 = 0xffffffffffffffff;
    local_e8 = psVar23->upload_blocked_len;
    CVar6 = CURLE_SEND_ERROR;
    if (local_e8 != 0) {
      if (len < local_e8) {
        Curl_failf(data,"HTTP/2 send again with decreased length (%zd vs %zd)",len,local_e8);
        CVar6 = CURLE_HTTP2;
        goto LAB_005d014a;
      }
      psVar23->upload_blocked_len = 0;
      bVar19 = true;
LAB_005cfe8d:
      _Var5 = Curl_bufq_is_empty(&psVar23->sendbuf);
      if (!_Var5) {
        iVar11 = nghttp2_session_resume_data(ctx->h2,psVar23->id);
        iVar11 = nghttp2_is_fatal(iVar11);
        CVar6 = CURLE_SEND_ERROR;
        if (iVar11 != 0) goto LAB_005d014a;
      }
      goto LAB_005cfb02;
    }
    if (psVar23->closed == true) {
      uVar10 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
      if (psVar23->resp_hds_complete == true) {
        CVar6 = CURLE_OK;
        uVar12 = len;
        if (((uVar10 >> 0x1c & 1) != 0) && (uVar12 = len, 0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] discarding dataon closed stream with response");
          CVar6 = CURLE_OK;
          uVar12 = len;
        }
      }
      else if ((uVar10 >> 0x1c & 1) != 0) {
        Curl_infof(data,"stream %u closed",(ulong)(uint)psVar23->id);
      }
LAB_005d014a:
      local_e8 = uVar12;
      *err = CVar6;
    }
    else {
      local_e8 = Curl_bufq_write(&psVar23->sendbuf,(uchar *)buf,len,err);
      bVar19 = false;
      if ((-1 < (long)local_e8) || (bVar19 = false, *err == CURLE_AGAIN)) goto LAB_005cfe8d;
    }
  }
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    uVar10 = psVar23->id;
    CVar6 = *err;
    cVar2 = psVar23->upload_left;
    iVar8 = nghttp2_session_get_stream_remote_window_size(ctx->h2,uVar10);
    iVar9 = nghttp2_session_get_remote_window_size(ctx->h2);
    sVar13 = Curl_bufq_len(&psVar23->sendbuf);
    sVar14 = Curl_bufq_len(&ctx->outbufq);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_send(len=%zu) -> %zd, %d, upload_left=%ld, h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)"
                      ,(ulong)uVar10,len,local_e8,(ulong)CVar6,cVar2,CONCAT44(extraout_var,iVar8),
                      CONCAT44(extraout_var_00,iVar9),sVar13,sVar14);
  }
LAB_005cfde8:
  *(Curl_easy **)((long)cf->ctx + 0x10) = local_a8;
  return local_e8;
}

Assistant:

static ssize_t cf_h2_send(struct Curl_cfilter *cf, struct Curl_easy *data,
                          const void *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  struct cf_call_data save;
  int rv;
  ssize_t nwritten;
  CURLcode result;
  int blocked = 0, was_blocked = 0;

  CF_DATA_SAVE(save, cf, data);

  if(stream && stream->id != -1) {
    if(stream->upload_blocked_len) {
      /* the data in `buf` has already been submitted or added to the
       * buffers, but have been EAGAINed on the last invocation. */
      /* TODO: this assertion triggers in OSSFuzz runs and it is not
       * clear why. Disable for now to let OSSFuzz continue its tests. */
      DEBUGASSERT(len >= stream->upload_blocked_len);
      if(len < stream->upload_blocked_len) {
        /* Did we get called again with a smaller `len`? This should not
         * happen. We are not prepared to handle that. */
        failf(data, "HTTP/2 send again with decreased length (%zd vs %zd)",
              len, stream->upload_blocked_len);
        *err = CURLE_HTTP2;
        nwritten = -1;
        goto out;
      }
      nwritten = (ssize_t)stream->upload_blocked_len;
      stream->upload_blocked_len = 0;
      was_blocked = 1;
    }
    else if(stream->closed) {
      if(stream->resp_hds_complete) {
        /* Server decided to close the stream after having sent us a findl
         * response. This is valid if it is not interested in the request
         * body. This happens on 30x or 40x responses.
         * We silently discard the data sent, since this is not a transport
         * error situation. */
        CURL_TRC_CF(data, cf, "[%d] discarding data"
                    "on closed stream with response", stream->id);
        *err = CURLE_OK;
        nwritten = (ssize_t)len;
        goto out;
      }
      infof(data, "stream %u closed", stream->id);
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
      goto out;
    }
    else {
      /* If stream_id != -1, we have dispatched request HEADERS and
       * optionally request body, and now are going to send or sending
       * more request body in DATA frame */
      nwritten = Curl_bufq_write(&stream->sendbuf, buf, len, err);
      if(nwritten < 0 && *err != CURLE_AGAIN)
        goto out;
    }

    if(!Curl_bufq_is_empty(&stream->sendbuf)) {
      /* req body data is buffered, resume the potentially suspended stream */
      rv = nghttp2_session_resume_data(ctx->h2, stream->id);
      if(nghttp2_is_fatal(rv)) {
        *err = CURLE_SEND_ERROR;
        nwritten = -1;
        goto out;
      }
    }
  }
  else {
    nwritten = h2_submit(&stream, cf, data, buf, len, err);
    if(nwritten < 0) {
      goto out;
    }
    DEBUGASSERT(stream);
  }

  /* Call the nghttp2 send loop and flush to write ALL buffered data,
   * headers and/or request body completely out to the network */
  result = h2_progress_egress(cf, data);
  /* if the stream has been closed in egress handling (nghttp2 does that
   * when it does not like the headers, for example */
  if(stream && stream->closed && !was_blocked) {
    infof(data, "stream %u closed", stream->id);
    *err = CURLE_SEND_ERROR;
    nwritten = -1;
    goto out;
  }
  else if(result == CURLE_AGAIN) {
    blocked = 1;
  }
  else if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }
  else if(stream && !Curl_bufq_is_empty(&stream->sendbuf)) {
    /* although we wrote everything that nghttp2 wants to send now,
     * there is data left in our stream send buffer unwritten. This may
     * be due to the stream's HTTP/2 flow window being exhausted. */
    blocked = 1;
  }

  if(stream && blocked && nwritten > 0) {
    /* Unable to send all data, due to connection blocked or H2 window
     * exhaustion. Data is left in our stream buffer, or nghttp2's internal
     * frame buffer or our network out buffer. */
    size_t rwin = nghttp2_session_get_stream_remote_window_size(ctx->h2,
                                                                stream->id);
    /* Whatever the cause, we need to return CURL_EAGAIN for this call.
     * We have unwritten state that needs us being invoked again and EAGAIN
     * is the only way to ensure that. */
    stream->upload_blocked_len = nwritten;
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) BLOCK: win %u/%zu "
                "blocked_len=%zu",
                stream->id, len,
                nghttp2_session_get_remote_window_size(ctx->h2), rwin,
                nwritten);
    *err = CURLE_AGAIN;
    nwritten = -1;
    goto out;
  }
  else if(should_close_session(ctx)) {
    /* nghttp2 thinks this session is done. If the stream has not been
     * closed, this is an error state for out transfer */
    if(stream->closed) {
      nwritten = http2_handle_stream_close(cf, data, stream, err);
    }
    else {
      CURL_TRC_CF(data, cf, "send: nothing to do in this session");
      *err = CURLE_HTTP2;
      nwritten = -1;
    }
  }

out:
  if(stream) {
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) -> %zd, %d, "
                "upload_left=%" CURL_FORMAT_CURL_OFF_T ", "
                "h2 windows %d-%d (stream-conn), "
                "buffers %zu-%zu (stream-conn)",
                stream->id, len, nwritten, *err,
                stream->upload_left,
                nghttp2_session_get_stream_remote_window_size(
                  ctx->h2, stream->id),
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&stream->sendbuf),
                Curl_bufq_len(&ctx->outbufq));
  }
  else {
    CURL_TRC_CF(data, cf, "cf_send(len=%zu) -> %zd, %d, "
                "connection-window=%d, nw_send_buffer(%zu)",
                len, nwritten, *err,
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&ctx->outbufq));
  }
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}